

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

void free_buffer(smf_t *smf)

{
  smf_track_t *psVar1;
  smf_track_t *track;
  int i;
  smf_t *smf_local;
  
  memset(smf->file_buffer,0,(long)smf->file_buffer_length);
  free(smf->file_buffer);
  smf->file_buffer = (void *)0x0;
  smf->file_buffer_length = 0;
  track._4_4_ = 1;
  while( true ) {
    if (smf->number_of_tracks < track._4_4_) {
      return;
    }
    psVar1 = smf_get_track_by_number(smf,track._4_4_);
    if (psVar1 == (smf_track_t *)0x0) break;
    psVar1->file_buffer = (void *)0x0;
    psVar1->file_buffer_length = 0;
    track._4_4_ = track._4_4_ + 1;
  }
  __assert_fail("track",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                ,0x1b2,"void free_buffer(smf_t *)");
}

Assistant:

static void
free_buffer(smf_t *smf)
{
	int i;
	smf_track_t *track;

	/* Clear the pointers. */
	memset(smf->file_buffer, 0, smf->file_buffer_length);
	free(smf->file_buffer);
	smf->file_buffer = NULL;
	smf->file_buffer_length = 0;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);
		assert(track);
		track->file_buffer = NULL;
		track->file_buffer_length = 0;
	}
}